

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelControl.cpp
# Opt level: O1

int trackerboy::ChannelControl<(trackerboy::ChType)1>::init(EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  ChannelState *in_RDX;
  WaveformTable *in_RSI;
  ChannelState fakeLast;
  ChannelState local_8;
  
  local_8._1_7_ = SUB87(*in_RDX,1);
  uVar1 = CONCAT71(local_8._1_7_,in_RDX->playing);
  local_8._5_3_ = SUB83(*in_RDX,5);
  local_8 = (ChannelState)
            (CONCAT26(~in_RDX->frequency,
                      (int6)CONCAT44(CONCAT31(local_8._5_3_,~in_RDX->panning),
                                     CONCAT13(~in_RDX->timbre,
                                              CONCAT12(~in_RDX->envelope,(short)uVar1)))) ^ 1);
  update((IApuIo *)ctx,in_RSI,&local_8,in_RDX);
  return local_8._0_4_;
}

Assistant:

void ChannelControl<ch>::init(IApuIo &apu, WaveformTable const& waveTable, ChannelState const& state) noexcept {
    ChannelState fakeLast = state;
    fakeLast.playing = !state.playing;
    fakeLast.envelope = ~state.envelope;
    fakeLast.panning = ~state.panning;
    fakeLast.timbre = ~state.timbre;
    fakeLast.frequency = ~state.frequency;
    update(apu, waveTable, fakeLast, state);
}